

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O2

REF_STATUS ref_subdiv_unmark_one_of_two(REF_SUBDIV ref_subdiv,REF_INT e0,REF_INT e1)

{
  uint uVar1;
  REF_GRID pRVar2;
  REF_NODE pRVar3;
  REF_INT *pRVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  
  pRVar2 = ref_subdiv->grid;
  pRVar3 = pRVar2->node;
  pRVar4 = ref_subdiv->edge->e2n;
  uVar1 = pRVar4[e0 * 2];
  lVar12 = (long)(int)uVar1;
  lVar7 = -1;
  lVar10 = -1;
  if ((-1 < lVar12) && (lVar10 = -1, (int)uVar1 < pRVar3->max)) {
    lVar10 = -1;
    if (-1 < pRVar3->global[lVar12]) {
      lVar10 = pRVar3->global[lVar12];
    }
  }
  iVar6 = pRVar4[(int)(e0 * 2 | 1)];
  uVar14 = (ulong)iVar6;
  lVar8 = -1;
  if ((long)uVar14 < 0) {
LAB_001f052f:
    if (-1 < (int)uVar1) {
      iVar9 = pRVar3->max;
LAB_001f0538:
      if (((int)uVar1 < iVar9) && (-1 < pRVar3->global[lVar12])) {
        lVar7 = pRVar3->global[lVar12];
      }
    }
    if (iVar6 < 0) {
      lVar10 = -1;
      if ((-1 < (int)uVar1) && (-1 < lVar7)) {
        iVar9 = pRVar3->max;
LAB_001f059c:
        if (iVar9 <= (int)uVar1) goto LAB_001f05c2;
        uVar14 = (ulong)uVar1;
LAB_001f05a4:
        lVar10 = -1;
        if (-1 < pRVar3->global[uVar14 & 0xffffffff]) {
          lVar10 = pRVar3->global[uVar14 & 0xffffffff];
        }
      }
    }
    else {
      iVar9 = pRVar3->max;
      if (iVar6 < iVar9) {
LAB_001f0559:
        lVar10 = -1;
        if (-1 < pRVar3->global[uVar14]) {
          lVar10 = pRVar3->global[uVar14];
        }
        if (lVar7 <= lVar10) goto LAB_001f05a4;
LAB_001f0597:
        if (-1 < (int)uVar1) goto LAB_001f059c;
      }
      else if (-1 < lVar7) goto LAB_001f0597;
LAB_001f05c2:
      lVar10 = -1;
    }
  }
  else {
    iVar9 = pRVar3->max;
    lVar8 = -1;
    if (iVar9 <= iVar6) goto LAB_001f052f;
    if (pRVar3->global[uVar14] <= lVar10) {
      lVar8 = -1;
      if (-1 < pRVar3->global[uVar14]) {
        lVar8 = pRVar3->global[uVar14];
      }
      goto LAB_001f052f;
    }
    if (-1 < (int)uVar1) {
      if ((int)uVar1 < iVar9) {
        lVar8 = -1;
        if (-1 < pRVar3->global[lVar12]) {
          lVar8 = pRVar3->global[lVar12];
        }
      }
      else {
        lVar8 = -1;
      }
      goto LAB_001f0538;
    }
    iVar9 = pRVar3->max;
    lVar7 = -1;
    lVar8 = lVar7;
    lVar10 = lVar7;
    if (iVar6 < iVar9) goto LAB_001f0559;
  }
  uVar1 = pRVar4[e1 * 2];
  lVar13 = (long)(int)uVar1;
  lVar7 = -1;
  lVar12 = -1;
  if ((-1 < lVar13) && (lVar12 = -1, (int)uVar1 < pRVar3->max)) {
    lVar12 = -1;
    if (-1 < pRVar3->global[lVar13]) {
      lVar12 = pRVar3->global[lVar13];
    }
  }
  iVar6 = pRVar4[(int)(e1 * 2 | 1)];
  uVar14 = (ulong)iVar6;
  lVar11 = -1;
  if ((long)uVar14 < 0) {
LAB_001f0677:
    if (-1 < (int)uVar1) {
      iVar9 = pRVar3->max;
LAB_001f067f:
      if ((int)uVar1 < iVar9) {
        lVar7 = -1;
        if (-1 < pRVar3->global[lVar13]) {
          lVar7 = pRVar3->global[lVar13];
        }
      }
    }
    if (iVar6 < 0) {
      lVar12 = -1;
      if (((int)uVar1 < 0) || (lVar7 < 0)) goto LAB_001f071d;
      iVar9 = pRVar3->max;
LAB_001f06ed:
      if ((int)uVar1 < iVar9) {
        uVar14 = (ulong)uVar1;
        goto LAB_001f06f5;
      }
    }
    else {
      iVar9 = pRVar3->max;
      if (iVar6 < iVar9) goto LAB_001f06aa;
      if (-1 < lVar7) goto LAB_001f06e8;
    }
  }
  else {
    iVar9 = pRVar3->max;
    lVar11 = -1;
    if (iVar9 <= iVar6) goto LAB_001f0677;
    if (pRVar3->global[uVar14] <= lVar12) {
      lVar11 = -1;
      if (-1 < pRVar3->global[uVar14]) {
        lVar11 = pRVar3->global[uVar14];
      }
      goto LAB_001f0677;
    }
    if (-1 < (int)uVar1) {
      if ((int)uVar1 < iVar9) {
        lVar11 = -1;
        if (-1 < pRVar3->global[lVar13]) {
          lVar11 = pRVar3->global[lVar13];
        }
      }
      else {
        lVar11 = -1;
      }
      goto LAB_001f067f;
    }
    iVar9 = pRVar3->max;
    lVar7 = -1;
    lVar11 = lVar7;
    lVar12 = lVar7;
    if (iVar9 <= iVar6) goto LAB_001f071d;
LAB_001f06aa:
    lVar12 = -1;
    if (-1 < pRVar3->global[uVar14]) {
      lVar12 = pRVar3->global[uVar14];
    }
    if (lVar7 <= lVar12) {
LAB_001f06f5:
      lVar12 = -1;
      if (-1 < pRVar3->global[uVar14 & 0xffffffff]) {
        lVar12 = pRVar3->global[uVar14 & 0xffffffff];
      }
      goto LAB_001f071d;
    }
LAB_001f06e8:
    if (-1 < (int)uVar1) goto LAB_001f06ed;
  }
  lVar12 = -1;
LAB_001f071d:
  bVar5 = lVar8 < lVar11;
  if (lVar8 == lVar11) {
    bVar5 = lVar10 < lVar12;
  }
  if (bVar5) {
    e0 = e1;
  }
  ref_subdiv->mark[e0] = 0;
  if (ref_subdiv->debug == 0) {
    return (REF_STATUS)pRVar2;
  }
  iVar6 = printf("unmark one of two proc %d edges %d %d\n",(ulong)(uint)pRVar2->mpi->id);
  return iVar6;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_unmark_one_of_two(REF_SUBDIV ref_subdiv,
                                                       REF_INT e0, REF_INT e1) {
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_EDGE ref_edge = ref_subdiv_edge(ref_subdiv);
  REF_GLOB e0min, e0max;
  REF_GLOB e1min, e1max;

  /* unmark the edge with the smallest edge globals */
  e0min = MIN(ref_node_global(ref_node, ref_edge_e2n(ref_edge, 0, e0)),
              ref_node_global(ref_node, ref_edge_e2n(ref_edge, 1, e0)));
  e0max = MAX(ref_node_global(ref_node, ref_edge_e2n(ref_edge, 0, e0)),
              ref_node_global(ref_node, ref_edge_e2n(ref_edge, 1, e0)));
  e1min = MIN(ref_node_global(ref_node, ref_edge_e2n(ref_edge, 0, e1)),
              ref_node_global(ref_node, ref_edge_e2n(ref_edge, 1, e1)));
  e1max = MAX(ref_node_global(ref_node, ref_edge_e2n(ref_edge, 0, e1)),
              ref_node_global(ref_node, ref_edge_e2n(ref_edge, 1, e1)));
  if (e0min == e1min) {
    if (e0max < e1max) {
      ref_subdiv_mark(ref_subdiv, e1) = 0;
    } else {
      ref_subdiv_mark(ref_subdiv, e0) = 0;
    }
  } else {
    if (e0min < e1min) {
      ref_subdiv_mark(ref_subdiv, e1) = 0;
    } else {
      ref_subdiv_mark(ref_subdiv, e0) = 0;
    }
  }

  if (ref_subdiv->debug)
    printf("unmark one of two proc %d edges %d %d\n",
           ref_mpi_rank(ref_subdiv_mpi(ref_subdiv)), e0, e1);

  return REF_SUCCESS;
}